

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

stbtt_uint32 stbtt__cff_int(stbtt__buf *b)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = b->cursor;
  iVar1 = b->size;
  if (iVar6 < iVar1) {
    b->cursor = iVar6 + 1;
    bVar2 = b->data[iVar6];
  }
  else {
    bVar2 = 0;
  }
  uVar3 = (uint)bVar2;
  if ((byte)(bVar2 - 0x20) < 0xd7) {
    uVar3 = uVar3 - 0x8b;
  }
  else if ((byte)(bVar2 + 9) < 4) {
    iVar6 = b->cursor;
    uVar5 = 0;
    if (iVar6 < iVar1) {
      b->cursor = iVar6 + 1;
      uVar5 = (uint)b->data[iVar6];
    }
    uVar3 = (uVar3 * 0x100 + uVar5) - 0xf694;
  }
  else if ((byte)(bVar2 + 5) < 4) {
    iVar6 = b->cursor;
    uVar5 = 0;
    if (iVar6 < iVar1) {
      b->cursor = iVar6 + 1;
      uVar5 = (uint)b->data[iVar6];
    }
    uVar3 = 0xfa94 - (uVar3 << 8 | uVar5);
  }
  else if (uVar3 == 0x1d) {
    iVar6 = b->cursor;
    uVar3 = 0;
    iVar4 = 4;
    do {
      if (iVar6 < iVar1) {
        lVar7 = (long)iVar6;
        iVar6 = iVar6 + 1;
        b->cursor = iVar6;
        uVar5 = (uint)b->data[lVar7];
      }
      else {
        uVar5 = 0;
      }
      uVar3 = uVar3 << 8 | uVar5;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  else {
    if (uVar3 != 0x1c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imstb_truetype.h"
                    ,0x4ab,"stbtt_uint32 stbtt__cff_int(stbtt__buf *)");
    }
    iVar6 = b->cursor;
    uVar3 = 0;
    iVar4 = 2;
    do {
      if (iVar6 < iVar1) {
        lVar7 = (long)iVar6;
        iVar6 = iVar6 + 1;
        b->cursor = iVar6;
        uVar5 = (uint)b->data[lVar7];
      }
      else {
        uVar5 = 0;
      }
      uVar3 = uVar3 << 8 | uVar5;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return uVar3;
}

Assistant:

static stbtt_uint32 stbtt__cff_int(stbtt__buf *b)
{
   int b0 = stbtt__buf_get8(b);
   if (b0 >= 32 && b0 <= 246)       return b0 - 139;
   else if (b0 >= 247 && b0 <= 250) return (b0 - 247)*256 + stbtt__buf_get8(b) + 108;
   else if (b0 >= 251 && b0 <= 254) return -(b0 - 251)*256 - stbtt__buf_get8(b) - 108;
   else if (b0 == 28)               return stbtt__buf_get16(b);
   else if (b0 == 29)               return stbtt__buf_get32(b);
   STBTT_assert(0);
   return 0;
}